

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
               (Builder reader,initializer_list<capnp::Data::Reader> expected)

{
  Exception *__s1;
  size_t __n;
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  bool bVar5;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  Fault f;
  ArrayPtr<unsigned_char> local_68;
  byte *local_58;
  ListElementCount local_4c;
  SegmentBuilder *local_48;
  CapTableBuilder *pCStack_40;
  
  puVar4 = (uchar *)expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (uchar *)(ulong)reader.builder.elementCount == puVar4;
  if (!_kjCondition.result) {
    local_68.ptr = puVar4;
    local_4c = reader.builder.elementCount;
    _kjCondition.left = (unsigned_long)puVar4;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x89,FAILED,"(expected.size()) == (reader.size())",
               "_kjCondition,expected.size(), reader.size()",&_kjCondition,
               (unsigned_long *)&local_68,&local_4c);
    kj::_::Debug::Fault::fatal(&f);
  }
  if (puVar4 != (uchar *)0x0) {
    local_48 = reader.builder.segment;
    pCStack_40 = reader.builder.capTable;
    local_58 = reader.builder.ptr;
    puVar2 = (uchar *)0x0;
    puVar3 = (uchar *)0x1;
    do {
      __s1 = (Exception *)expected._M_array[(long)puVar2].super_ArrayPtr<const_unsigned_char>.ptr;
      __n = expected._M_array[(long)puVar2].super_ArrayPtr<const_unsigned_char>.size_;
      _kjCondition.op.content.ptr =
           (char *)(local_58 + ((long)puVar2 * (ulong)reader.builder.step >> 3));
      _kjCondition.left = (unsigned_long)local_48;
      _kjCondition._8_8_ = pCStack_40;
      local_68 = (ArrayPtr<unsigned_char>)
                 PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition,(void *)0x0,0)
      ;
      f.exception = __s1;
      if (__n == local_68.size_) {
        if (__n != 0) {
          iVar1 = bcmp(__s1,local_68.ptr,__n);
          _kjCondition.op.content.size_ = 5;
          _kjCondition.result = iVar1 == 0;
          if (!_kjCondition.result) goto joined_r0x00202854;
        }
      }
      else {
        _kjCondition.result = false;
joined_r0x00202854:
        _kjCondition.op.content.size_ = 5;
        if (kj::_::Debug::minSeverity < 3) {
          _kjCondition.op.content.size_ = 5;
          _kjCondition.op.content.ptr = " == ";
          _kjCondition._8_8_ = &local_68;
          _kjCondition.left = (unsigned_long)&f;
          kj::_::Debug::
          log<char_const(&)[28],kj::_::DebugComparison<capnp::Data::Reader&,capnp::Data::Reader&>&,capnp::Data::Reader&,capnp::Data::Reader&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                     (char (*) [28])"failed: expected (a) == (b)",
                     (DebugComparison<capnp::Data::Reader_&,_capnp::Data::Reader_&> *)&_kjCondition,
                     (Reader *)_kjCondition.left,(Reader *)_kjCondition._8_8_);
        }
      }
      bVar5 = puVar3 < puVar4;
      puVar2 = puVar3;
      puVar3 = (uchar *)(ulong)((int)puVar3 + 1);
    } while (bVar5);
  }
  return;
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}